

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdCircularList.h
# Opt level: O2

double __thiscall HACD::ICHUll::ComputeVolume(ICHUll *this)

{
  CircularListElement<HACD::TMMTriangle> *pCVar1;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 in_ZMM2 [64];
  undefined1 auVar10 [16];
  Vec3<double> ver2;
  Vec3<double> ver1;
  Vec3<double> ver0;
  Vec3<double> bary;
  Vec3<double> local_a8;
  Vec3<double> local_88;
  Vec3<double> local_68;
  undefined1 local_48 [16];
  double local_38;
  
  sVar4 = (this->m_mesh).m_vertices.m_size;
  dVar9 = 0.0;
  if ((sVar4 != 0) && (dVar9 = 0.0, this->m_isFlat == false)) {
    pCVar2 = (this->m_mesh).m_vertices.m_head;
    local_38 = 0.0;
    sVar3 = sVar4;
    auVar7 = ZEXT816(0) << 0x40;
    while (bVar5 = sVar3 != 0, sVar3 = sVar3 - 1, bVar5) {
      auVar8._0_8_ = auVar7._0_8_ + (pCVar2->m_data).m_pos.m_data[0];
      auVar8._8_8_ = auVar7._8_8_ + (pCVar2->m_data).m_pos.m_data[1];
      local_38 = local_38 + (pCVar2->m_data).m_pos.m_data[2];
      pCVar2 = pCVar2->m_next;
      (this->m_mesh).m_vertices.m_head = pCVar2;
      auVar7 = auVar8;
    }
    auVar8 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,sVar4);
    dVar9 = auVar8._0_8_;
    auVar10._8_8_ = dVar9;
    auVar10._0_8_ = dVar9;
    local_38 = local_38 / dVar9;
    local_48 = vdivpd_avx(auVar7,auVar10);
    dVar9 = 0.0;
    sVar4 = (this->m_mesh).m_triangles.m_size;
    while (bVar5 = sVar4 != 0, sVar4 = sVar4 - 1, bVar5) {
      pCVar1 = (this->m_mesh).m_triangles.m_head;
      pCVar2 = (pCVar1->m_data).m_vertices[0];
      local_68.m_data[0] = (pCVar2->m_data).m_pos.m_data[0];
      local_68.m_data[1] = (pCVar2->m_data).m_pos.m_data[1];
      local_68.m_data[2] = (pCVar2->m_data).m_pos.m_data[2];
      pCVar2 = (pCVar1->m_data).m_vertices[1];
      local_88.m_data[0] = (pCVar2->m_data).m_pos.m_data[0];
      local_88.m_data[1] = (pCVar2->m_data).m_pos.m_data[1];
      local_88.m_data[2] = (pCVar2->m_data).m_pos.m_data[2];
      pCVar2 = (pCVar1->m_data).m_vertices[2];
      local_a8.m_data[0] = (pCVar2->m_data).m_pos.m_data[0];
      local_a8.m_data[1] = (pCVar2->m_data).m_pos.m_data[1];
      local_a8.m_data[2] = (pCVar2->m_data).m_pos.m_data[2];
      dVar6 = Volume<double>(&local_68,&local_88,&local_a8,(Vec3<double> *)local_48);
      if ((this->m_mesh).m_triangles.m_size != 0) {
        (this->m_mesh).m_triangles.m_head = ((this->m_mesh).m_triangles.m_head)->m_next;
      }
      dVar9 = dVar9 + dVar6;
    }
  }
  return dVar9;
}

Assistant:

size_t                                  GetSize() const { return m_size; }